

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int buffer_reserve(BUFFER *buf,size_t n)

{
  int iVar1;
  size_t alloc;
  ulong requested_alloc;
  
  requested_alloc = n + buf->size;
  if (requested_alloc < buf->alloc) {
    return 0;
  }
  alloc = buffer_good_alloc_size(requested_alloc);
  iVar1 = buffer_realloc(buf,alloc);
  return iVar1;
}

Assistant:

int
buffer_reserve(BUFFER* buf, size_t n)
{
    size_t alloc;

    if(buf->size + n < buf->alloc)
        return 0;

    alloc = buf->size + n;
    alloc = buffer_good_alloc_size(alloc);

    return buffer_realloc(buf, alloc);
}